

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

void cmakemainMessageCallback(char *m,char *param_2,bool *param_3,void *clientdata)

{
  ostream *poVar1;
  void *this;
  string local_48;
  void *local_28;
  void *clientdata_local;
  bool *param_2_local;
  char *param_1_local;
  char *m_local;
  
  local_28 = clientdata;
  clientdata_local = param_3;
  param_2_local = (bool *)param_2;
  param_1_local = m;
  poVar1 = std::operator<<((ostream *)&std::cerr,m);
  cmakemainGetStack_abi_cxx11_(&local_48,local_28);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  this = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

static void cmakemainMessageCallback(const char* m, const char*, bool&,
                                     void *clientdata)
{
  std::cerr << m << cmakemainGetStack(clientdata) << std::endl << std::flush;
}